

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvrktest.cpp
# Opt level: O2

Result TestAnalogInputs(AmpIO **Board,BasePort *Port)

{
  unsigned_long uVar1;
  int iVar2;
  uint32_t uVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  uint index;
  long lVar8;
  Result local_5c;
  
  (*Port->_vptr_BasePort[0x1d])(Port);
  uVar5 = 0;
  lVar6 = 0;
  local_5c = pass;
  do {
    if (NUM_FPGA <= lVar6) {
      return local_5c;
    }
    iVar2 = (int)lVar6;
    for (lVar8 = 0; lVar8 < NUM_CHANNEL_PER_FPGA; lVar8 = lVar8 + 1) {
      index = (uint)lVar8;
      uVar3 = AmpIO::GetAnalogInput(Board[lVar6],index);
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      poVar4 = std::operator<<((ostream *)&std::cout,"board ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4," pot channel ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,index);
      poVar4 = std::operator<<(poVar4," - ");
      poVar4 = std::operator<<(poVar4," expected=");
      uVar1 = POT_TEST_ADC_COUNT[lVar8 + uVar5];
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," measured=");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      *(uint *)(&DAT_001234b0 + *(long *)(logfile + -0x18)) =
           *(uint *)(&DAT_001234b0 + *(long *)(logfile + -0x18)) & 0xffffffb5 | 8;
      poVar4 = std::operator<<((ostream *)&logfile,"board ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4," pot channel ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,index);
      poVar4 = std::operator<<(poVar4," - ");
      poVar4 = std::operator<<(poVar4," expected=");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," measured=");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      if (ABS((double)(long)(uVar3 - uVar1)) <= 1280.0) {
        poVar4 = std::operator<<((ostream *)&std::cout," ... \x1b[0;32m[PASS]\x1b[0m");
        pcVar7 = "... PASS";
LAB_00106483:
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&logfile,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout," ... \x1b[1;91m[FAIL]\x1b[0m");
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&logfile,"... FAIL");
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&logfile,"Tolerance=");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
        local_5c = fail;
        if (ABS((double)(long)((ulong)uVar3 - POT_TEST_ADC_COUNT[lVar8 + (ulong)(iVar2 * 4 ^ 4)])) <
            1280.0) {
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)&COLOR_ERROR_abi_cxx11_);
          poVar4 = std::operator<<(poVar4,"(Looks like the 68-pin cable is crossed!)");
          poVar4 = std::operator<<(poVar4,(string *)&COLOR_OFF_abi_cxx11_);
          pcVar7 = "Crossed scsi?";
          local_5c = fatal_fail;
          goto LAB_00106483;
        }
      }
    }
    lVar6 = lVar6 + 1;
    uVar5 = (ulong)((int)uVar5 + 4);
  } while( true );
}

Assistant:

Result TestAnalogInputs(AmpIO **Board, BasePort *Port) {
    Result result = pass;
    Port->ReadAllBoards();
    for (int board_index = 0; board_index < NUM_FPGA; board_index++) {
        for (int channel_index = 0; channel_index < NUM_CHANNEL_PER_FPGA; channel_index++) {
            unsigned long reading = Board[board_index]->GetAnalogInput(channel_index);
            std::cout << std::hex << "board " << board_index << " pot channel " << channel_index << " - "
                        << " expected="
                        << POT_TEST_ADC_COUNT[board_index * 4 + channel_index] << " measured=" << reading;
            logfile << std::hex << "board " << board_index << " pot channel " << channel_index << " - "
                        << " expected="
                        << POT_TEST_ADC_COUNT[board_index * 4 + channel_index] << " measured=" << reading;
            if (std::fabs((long) reading - (long) POT_TEST_ADC_COUNT[board_index * 4 + channel_index]) > POT_TEST_ADC_ERROR_TOLERANCE) {
                std::cout << FAIL << std::endl;
                logfile << "... FAIL" << std::endl;
                logfile << "Tolerance=" << POT_TEST_ADC_ERROR_TOLERANCE << std::endl;
                result = fail;
                // check for swapped cable
                if (std::fabs((long) reading - (long) POT_TEST_ADC_COUNT[(1 ^ board_index)  * 4 + channel_index]) <
                    POT_TEST_ADC_ERROR_TOLERANCE) {
                    std::cout << COLOR_ERROR << "(Looks like the 68-pin cable is crossed!)" << COLOR_OFF
                                << std::endl;
                    logfile << "Crossed scsi?" << std::endl;
                    result = fatal_fail;
                }

            } else {
                std::cout << PASS << std::endl;
                logfile << "... PASS" << std::endl;
            }
        }
    }
    
    return result;
}